

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int balance(BtCursor *pCur)

{
  void *__dest;
  Pgno *pPVar1;
  byte bVar2;
  byte bVar3;
  u8 uVar4;
  ushort uVar5;
  ushort uVar6;
  PgHdr *pPVar7;
  u8 uVar8;
  u8 uVar9;
  i64 iVar10;
  ulong uVar11;
  u16 uVar12;
  u16 uVar13;
  ushort uVar14;
  int iVar15;
  u32 uVar16;
  int iVar17;
  void *pvVar18;
  MemPage **ppMVar19;
  ulong uVar20;
  Pgno PVar21;
  uint uVar22;
  long lVar23;
  undefined1 *puVar24;
  long lVar25;
  ulong uVar26;
  uint uVar27;
  MemPage *pMVar28;
  undefined4 *puVar29;
  MemPage *pMVar30;
  MemPage **ppMVar31;
  MemPage *pMVar32;
  char cVar33;
  uint uVar34;
  int iVar35;
  int nCell;
  u8 *puVar36;
  MemPage *pMVar37;
  ulong uVar38;
  MemPage *pMVar39;
  int iFirst;
  ulong uVar40;
  MemPage **ppMVar41;
  uint *puVar42;
  uint uVar43;
  uint uVar44;
  int iVar45;
  u8 *puVar47;
  MemPage *pPage;
  BtShared *pBVar48;
  long lVar49;
  size_t __n;
  bool bVar50;
  int local_29c;
  MemPage *local_298;
  ulong local_290;
  MemPage *local_288;
  ulong local_280;
  MemPage *local_278;
  BtCursor *local_270;
  char local_261;
  MemPage *local_260;
  MemPage *local_258;
  BtShared *local_250;
  MemPage **local_248;
  MemPage *local_240;
  MemPage *local_238;
  MemPage *local_230;
  Pgno local_224;
  undefined8 local_220;
  Pgno pgnoNew;
  uint local_214 [7];
  MemPage *apOld [3];
  int szNew [5];
  u8 abDone [5];
  char local_1a0;
  void *local_180;
  CellInfo local_170;
  MemPage *pNew;
  MemPage *local_150 [4];
  uint *local_130;
  MemPage *local_128;
  uint local_120;
  uint local_11c;
  u16 szCell;
  MemPage *pChild;
  MemPage *local_f8;
  MemPage **local_f0;
  MemPage *local_e8;
  u8 *local_e0 [5];
  uint auStack_b4 [7];
  Pgno aPgOrder [5];
  long lStack_80;
  u8 *apDiv [2];
  u16 aPgFlags [5];
  u8 aBalanceQuickSpace [13];
  Pgno aPgno [5];
  MemPage *pMVar46;
  
  local_11c = (pCur->pBt->usableSize * 2) / 3;
  cVar33 = pCur->iPage;
  local_180 = (void *)0x0;
  pPage = pCur->pPage;
  local_270 = pCur;
LAB_001707d9:
  if ((pPage->nFree < 0) && (iVar15 = btreeComputeFreeSpace(pPage), iVar15 != 0)) {
LAB_001721f9:
    iVar15 = 0;
  }
  else {
    if (cVar33 != '\0') {
      if ((pPage->nOverflow == '\0') && (pPage->nFree <= (int)local_11c)) goto LAB_001721f9;
      pMVar37 = pCur->apPage[(long)cVar33 + -1];
      uVar14 = pCur->aiIdx[(long)cVar33 + -1];
      iVar15 = sqlite3PagerWrite(pMVar37->pDbPage);
      pvVar18 = local_180;
      if ((iVar15 == 0) &&
         ((local_261 = cVar33, -1 < pMVar37->nFree ||
          (iVar15 = btreeComputeFreeSpace(pMVar37), iVar15 == 0)))) {
        if ((pPage->intKeyLeaf != '\0') &&
           ((((pPage->nOverflow == '\x01' && (pPage->aiOvfl[0] == pPage->nCell)) &&
             (pMVar37->pgno != 1)) && (pMVar37->nCell == uVar14)))) {
          if (pPage->aiOvfl[0] == 0) {
            iVar15 = sqlite3CorruptError(0x11355);
          }
          else {
            pBVar48 = pPage->pBt;
            iVar15 = allocateBtreePage(pBVar48,&pNew,&pgnoNew,0,'\0');
            if (iVar15 == 0) {
              apOld[0] = (MemPage *)pPage->apOvfl[0];
              szCell = (*pPage->xCellSize)(pPage,(u8 *)apOld[0]);
              pMVar46 = (MemPage *)CONCAT44(pNew._4_4_,(int)pNew);
              zeroPage(pMVar46,0xd);
              pChild = (MemPage *)CONCAT44(pChild._4_4_,1);
              local_f0 = apOld;
              local_e8 = (MemPage *)&szCell;
              local_e0[0] = pPage->aDataEnd;
              auStack_b4[1] = 2;
              local_f8 = pPage;
              iVar15 = rebuildPage((CellArray *)&pChild,0,1,pMVar46);
              local_170.nKey = CONCAT44(local_170.nKey._4_4_,iVar15);
              if (iVar15 == 0) {
                pMVar46->nFree =
                     (pBVar48->usableSize - ((uint)szCell + (uint)pMVar46->cellOffset)) + -2;
                if ((pBVar48->autoVacuum != '\0') &&
                   (ptrmapPut(pBVar48,pgnoNew,'\x05',pMVar37->pgno,(int *)&local_170),
                   pMVar46->minLocal < szCell)) {
                  ptrmapPutOvflPtr(pMVar46,pMVar46,&apOld[0]->isInit,(int *)&local_170);
                }
                uVar38 = (ulong)(CONCAT11(pPage->aCellIdx[(ulong)pPage->nCell * 2 + -2],
                                          pPage->aCellIdx[(ulong)pPage->nCell * 2 + -1]) &
                                pPage->maskPage);
                uVar40 = 0;
                puVar36 = pPage->aData + uVar38;
                pMVar32 = (MemPage *)(pPage->aData + uVar38 + 2);
                do {
                  pMVar39 = pMVar32;
                  puVar47 = puVar36;
                  if (7 < uVar40) break;
                  uVar40 = uVar40 + 1;
                  puVar36 = puVar47 + 1;
                  pMVar32 = (MemPage *)&pMVar39->bBusy;
                } while ((char)*puVar47 < '\0');
                lVar25 = 4;
                do {
                  apOld[0] = pMVar39;
                  uVar4 = *(u8 *)((long)&apOld[0][-1].xParseCell + 7);
                  aBalanceQuickSpace[lVar25] = uVar4;
                  lVar25 = lVar25 + 1;
                  if (-1 < (char)uVar4) break;
                  pMVar39 = (MemPage *)&apOld[0]->bBusy;
                } while (apOld[0] < (MemPage *)(puVar47 + 10));
                if ((int)local_170.nKey == 0) {
                  insertCell(pMVar37,(uint)pMVar37->nCell,aBalanceQuickSpace,(int)lVar25,(u8 *)0x0,
                             pPage->pgno,(int *)&local_170);
                }
                *(Pgno *)(pMVar37->aData + (ulong)pMVar37->hdrOffset + 8) =
                     pgnoNew >> 0x18 | (pgnoNew & 0xff0000) >> 8 | (pgnoNew & 0xff00) << 8 |
                     pgnoNew << 0x18;
                iVar15 = (int)local_170.nKey;
              }
              releasePage(pMVar46);
            }
          }
          goto LAB_00171441;
        }
        pvVar18 = pcache1Alloc(pCur->pBt->pageSize);
        abDone[0] = '\0';
        abDone[1] = '\0';
        abDone[2] = '\0';
        abDone[3] = '\0';
        pChild = (MemPage *)((ulong)pChild & 0xffffffff00000000);
        local_f0 = (MemPage **)0x0;
        abDone[4] = '\0';
        iVar15 = 7;
        if (pvVar18 != (void *)0x0) {
          uVar43 = pCur->hints & 1;
          uVar44 = (uint)pMVar37->nCell + (uint)pMVar37->nOverflow;
          local_280 = 0;
          if (1 < uVar44) {
            uVar27 = (uint)uVar14;
            if (uVar27 == 0) {
              local_280 = 0;
            }
            else if (uVar44 == uVar27) {
              local_280 = (ulong)((uVar14 + uVar43) - 2);
            }
            else {
              local_280 = (ulong)(uVar27 - 1);
            }
            uVar44 = 2 - uVar43;
          }
          pMVar46 = (MemPage *)(ulong)uVar44;
          uVar27 = ((int)local_280 - (uint)pMVar37->nOverflow) + uVar44;
          if (uVar27 == pMVar37->nCell) {
            uVar38 = (ulong)pMVar37->hdrOffset + 8;
          }
          else {
            uVar38 = (ulong)(CONCAT11(pMVar37->aCellIdx[(long)(int)uVar27 * 2],
                                      pMVar37->aCellIdx[(long)(int)uVar27 * 2 + 1]) &
                            pMVar37->maskPage);
          }
          local_130 = (uint *)(pMVar37->aData + uVar38);
          pBVar48 = pMVar37->pBt;
          local_248 = (MemPage **)CONCAT44(local_248._4_4_,uVar44 + 1);
          uVar16 = sqlite3Get4byte((u8 *)local_130);
          local_278 = (MemPage *)CONCAT44(local_278._4_4_,uVar16);
          __n = (size_t)(uVar44 * 8);
          uVar44 = (int)local_280 + -1 + uVar44;
          local_288 = (MemPage *)(szNew + (long)((long)&pMVar46[-1].xParseCell + 7));
          local_250 = pBVar48;
          local_240 = pMVar46;
          local_128 = pMVar46;
          while( true ) {
            local_29c = getAndInitPage(pBVar48,(Pgno)local_278,(MemPage **)((long)apOld + __n),
                                       (BtCursor *)0x0,0);
            pMVar32 = (MemPage *)((ulong)local_248 & 0xffffffff);
            if (local_29c != 0) break;
            pMVar39 = *(MemPage **)((long)apOld + __n);
            if ((pMVar39->nFree < 0) && (local_29c = btreeComputeFreeSpace(pMVar39), local_29c != 0)
               ) goto LAB_00170d67;
            local_260 = pMVar32;
            if (__n == 0) {
              local_224 = (Pgno)local_278;
              uVar44 = ((pBVar48->pageSize - 8) / 6 + 4) * (uint)local_248 + 3 & 0xfffffffc;
              ppMVar19 = (MemPage **)sqlite3Malloc((long)(int)(uVar44 * 10 + pBVar48->pageSize));
              pMVar39 = apOld[0];
              local_f0 = ppMVar19;
              if (ppMVar19 != (MemPage **)0x0) {
                lVar25 = (long)(int)uVar44;
                local_230 = (MemPage *)(ppMVar19 + lVar25);
                local_e8 = local_230;
                local_238 = (MemPage *)(local_230->aiOvfl + lVar25 + -0xe);
                local_f8 = apOld[0];
                bVar2 = apOld[0]->leaf;
                local_290 = (ulong)bVar2 << 2;
                local_278 = (MemPage *)(ulong)apOld[0]->intKeyLeaf;
                pMVar30 = (MemPage *)0x0;
                iVar15 = 0;
                pMVar28 = (MemPage *)0x0;
                local_258 = pMVar37;
                goto LAB_00170e40;
              }
              local_29c = 7;
              pCur = local_270;
              goto LAB_00171396;
            }
            local_240 = (MemPage *)((long)&local_240[-1].xParseCell + 7);
            uVar27 = uVar44;
            if (pMVar37->nOverflow == 0) {
LAB_00170c97:
              local_298 = (MemPage *)CONCAT44(local_298._4_4_,uVar44);
              lVar25 = (long)(int)(uVar27 - pMVar37->nOverflow);
              puVar36 = pMVar37->aData +
                        (CONCAT11(pMVar37->aCellIdx[lVar25 * 2],pMVar37->aCellIdx[lVar25 * 2 + 1]) &
                        pMVar37->maskPage);
              *(u8 **)((long)&lStack_80 + __n) = puVar36;
              uVar16 = sqlite3Get4byte(puVar36);
              local_278 = (MemPage *)CONCAT44(local_278._4_4_,uVar16);
              uVar12 = (*pMVar37->xCellSize)(pMVar37,puVar36);
              uVar44 = (uint)uVar12;
              local_288->isInit = (char)uVar44;
              local_288->bBusy = (char)(uVar44 >> 8);
              local_288->intKey = (char)(uVar44 >> 0x10);
              local_288->intKeyLeaf = (char)(uVar44 >> 0x18);
              if ((pBVar48->btsFlags & 0xc) != 0) {
                iVar15 = (int)puVar36 - *(int *)&pMVar37->aData;
                if ((int)pBVar48->usableSize < (int)(iVar15 + (uint)uVar12)) {
                  local_29c = sqlite3CorruptError(0x114ba);
                  memset(apOld,0,__n);
                  pCur = local_270;
                  pMVar32 = local_260;
                  uVar44 = 0;
                  iVar15 = local_29c;
                  goto LAB_001713c5;
                }
                memcpy((void *)((long)iVar15 + (long)pvVar18),puVar36,(ulong)uVar44);
                *(long *)((long)&lStack_80 + __n) =
                     ((long)puVar36 - (long)pMVar37->aData) + (long)pvVar18;
                pBVar48 = local_250;
              }
              dropCell(pMVar37,uVar27 - pMVar37->nOverflow,(uint)uVar12,&local_29c);
              uVar44 = (uint)local_298;
            }
            else {
              if (uVar44 != pMVar37->aiOvfl[0]) {
                uVar27 = (int)local_280 + (int)local_240;
                goto LAB_00170c97;
              }
              puVar36 = pMVar37->apOvfl[0];
              *(u8 **)((long)&lStack_80 + __n) = puVar36;
              uVar16 = sqlite3Get4byte(puVar36);
              local_278 = (MemPage *)CONCAT44(local_278._4_4_,uVar16);
              uVar12 = (*pMVar37->xCellSize)(pMVar37,puVar36);
              uVar27 = (uint)uVar12;
              local_288->isInit = (char)uVar27;
              local_288->bBusy = (char)(uVar27 >> 8);
              local_288->intKey = (char)(uVar27 >> 0x10);
              local_288->intKeyLeaf = (char)(uVar27 >> 0x18);
              pMVar37->nOverflow = '\0';
            }
            __n = __n - 8;
            uVar44 = uVar44 - 1;
            local_288 = (MemPage *)((long)&local_288[-1].xParseCell + 4);
          }
          __n = __n + 8;
LAB_00170d67:
          memset(apOld,0,__n);
          pCur = local_270;
          uVar44 = 0;
          iVar15 = local_29c;
          goto LAB_001713c5;
        }
        goto LAB_0017141f;
      }
      goto LAB_00171441;
    }
    if (pPage->nOverflow == '\0') goto LAB_001721f9;
    pChild = (MemPage *)0x0;
    apOld[0] = (MemPage *)((ulong)apOld[0] & 0xffffffff00000000);
    pBVar48 = pPage->pBt;
    iVar15 = sqlite3PagerWrite(pPage->pDbPage);
    if (iVar15 == 0) {
      pNew._0_4_ = allocateBtreePage(pBVar48,&pChild,(Pgno *)apOld,pPage->pgno,'\0');
      pMVar37 = pChild;
      copyNodeContent(pPage,pChild,(int *)&pNew);
      if (pBVar48->autoVacuum != '\0') {
        ptrmapPut(pBVar48,(Pgno)apOld[0],'\x05',pPage->pgno,(int *)&pNew);
      }
      iVar15 = (int)pNew;
      if ((int)pNew != 0) goto LAB_00172204;
      memcpy(pMVar37->aiOvfl,pPage->aiOvfl,(ulong)((uint)pPage->nOverflow * 2));
      memcpy(pMVar37->apOvfl,pPage->apOvfl,(ulong)pPage->nOverflow << 3);
      pMVar37->nOverflow = pPage->nOverflow;
      zeroPage(pPage,*pMVar37->aData & 0xfffffff7);
      *(Pgno *)(pPage->aData + (ulong)pPage->hdrOffset + 8) =
           (Pgno)apOld[0] >> 0x18 | ((Pgno)apOld[0] & 0xff0000) >> 8 |
           ((Pgno)apOld[0] & 0xff00) << 8 | (Pgno)apOld[0] << 0x18;
      pCur->apPage[1] = pMVar37;
      pCur->iPage = '\x01';
      pCur->ix = 0;
      pCur->aiIdx[0] = 0;
      pCur->apPage[0] = pPage;
      iVar15 = 0;
      cVar33 = '\x01';
      goto LAB_00171466;
    }
    pMVar37 = (MemPage *)0x0;
LAB_00172204:
    pCur->apPage[1] = (MemPage *)0x0;
    releasePage(pMVar37);
  }
  goto LAB_00172215;
LAB_00170e40:
  local_220 = (MemPage *)(local_290 & 0xffff);
  if (pMVar30 != pMVar32) {
    pMVar37 = apOld[(long)pMVar30];
    puVar36 = pMVar37->aData;
    if (*puVar36 == *pMVar39->aData) {
      uVar14 = pMVar37->nCell;
      uVar5 = pMVar37->maskPage;
      puVar47 = puVar36 + pMVar37->cellOffset;
      uVar38 = (ulong)iVar15;
      local_298 = pMVar28;
      local_288 = pMVar30;
      local_240 = pMVar37;
      memset(local_230->aiOvfl + (uVar38 - 0xe),0,
             (ulong)(((uint)uVar14 + (uint)pMVar37->nOverflow) * 2));
      bVar3 = local_240->nOverflow;
      if ((ulong)bVar3 == 0) goto LAB_00170f5a;
      uVar44 = (uint)local_240->aiOvfl[0];
      if (local_240->aiOvfl[0] <= uVar14) {
        lVar23 = uVar38 << 0x20;
        ppMVar31 = ppMVar19 + uVar38;
        while (bVar50 = uVar44 != 0, uVar44 = uVar44 - 1, bVar50) {
          ppMVar19[uVar38] = (MemPage *)(puVar36 + (CONCAT11(*puVar47,puVar47[1]) & uVar5));
          puVar47 = puVar47 + 2;
          uVar38 = uVar38 + 1;
          lVar23 = lVar23 + 0x100000000;
          iVar15 = iVar15 + 1;
          ppMVar31 = ppMVar31 + 1;
        }
        for (uVar38 = 0; bVar3 != uVar38; uVar38 = uVar38 + 1) {
          *ppMVar31 = (MemPage *)local_240->apOvfl[uVar38];
          lVar23 = lVar23 + 0x100000000;
          iVar15 = iVar15 + 1;
          ppMVar31 = ppMVar31 + 1;
        }
        pChild = (MemPage *)CONCAT44(pChild._4_4_,iVar15);
        uVar38 = lVar23 >> 0x20;
        goto LAB_00170f5a;
      }
      iVar15 = 0x11515;
LAB_001713af:
      iVar15 = sqlite3CorruptError(iVar15);
      pCur = local_270;
      pMVar32 = local_260;
      uVar44 = 0;
      goto LAB_001713c5;
    }
    iVar15 = 0x114fd;
    goto LAB_0017138d;
  }
  goto LAB_001710fa;
LAB_00170f5a:
  uVar14 = local_240->cellOffset;
  uVar6 = local_240->nCell;
  lVar23 = uVar38 << 0x20;
  for (; puVar47 < puVar36 + (ulong)uVar6 * 2 + (ulong)uVar14; puVar47 = puVar47 + 2) {
    ppMVar19[uVar38] = (MemPage *)(puVar36 + (uVar5 & CONCAT11(*puVar47,puVar47[1])));
    uVar38 = uVar38 + 1;
    pChild = (MemPage *)CONCAT44(pChild._4_4_,(int)uVar38);
    lVar23 = lVar23 + 0x100000000;
  }
  *(int *)(&szCell + (long)local_288 * 2) = (int)uVar38;
  pMVar28 = local_298;
  if ((local_288 < pMVar46) && ((char)local_278 == '\0')) {
    uVar44 = szNew[(long)local_288] & 0xffff;
    lVar49 = lVar23 >> 0x1f;
    *(short *)((long)local_230->aiOvfl + lVar49 + -0x1c) = (short)szNew[(long)local_288];
    __dest = (void *)((long)local_238->aiOvfl + (long)(int)local_298 + -0x1c);
    uVar27 = (int)local_298 + uVar44;
    pMVar28 = (MemPage *)(ulong)uVar27;
    memcpy(__dest,apDiv[(long)local_288],(ulong)uVar44);
    puVar29 = (undefined4 *)((long)__dest + local_290);
    *(undefined4 **)((long)ppMVar19 + (lVar23 >> 0x1d)) = puVar29;
    local_220._0_4_ = (uint)*(ushort *)((long)local_230->aiOvfl + lVar49 + -0x1c) - (int)local_220;
    *(short *)((long)local_230->aiOvfl + lVar49 + -0x1c) = (short)(int)local_220;
    if (local_240->leaf == '\0') {
      *puVar29 = *(undefined4 *)(local_240->aData + 8);
    }
    else {
      puVar24 = (undefined1 *)((long)ppMVar19 + (long)(int)uVar27 + lVar25 * 10);
      while ((ushort)(int)local_220 < 4) {
        *puVar24 = 0;
        local_220._0_4_ = local_230->aiOvfl[(lVar23 >> 0x20) + -0xe] + 1;
        local_230->aiOvfl[(lVar23 >> 0x20) + -0xe] = (u16)(int)local_220;
        pMVar28 = (MemPage *)(ulong)((int)pMVar28 + 1);
        puVar24 = puVar24 + 1;
      }
    }
    uVar44 = (int)uVar38 + 1;
    uVar38 = (ulong)uVar44;
    pChild = (MemPage *)CONCAT44(pChild._4_4_,uVar44);
  }
  pMVar30 = (MemPage *)&local_288->bBusy;
  iVar15 = (int)uVar38;
  pMVar32 = local_260;
  pBVar48 = local_250;
  goto LAB_00170e40;
LAB_001710fa:
  local_240 = (MemPage *)
              CONCAT44(local_240._4_4_,pBVar48->usableSize + (uint)(ushort)local_290 + -0xc);
  iVar15 = 0;
  for (pMVar37 = (MemPage *)0x0; pMVar37 != pMVar32; pMVar37 = (MemPage *)&pMVar37->bBusy) {
    pMVar32 = apOld[(long)pMVar37];
    local_e0[iVar15] = pMVar32->aDataEnd;
    uVar44 = *(uint *)(&szCell + (long)pMVar37 * 2);
    auStack_b4[(long)iVar15 + 1] = uVar44;
    if (iVar15 == 0) {
      iVar45 = 0;
    }
    else {
      iVar45 = iVar15 + -1;
      if (uVar44 != auStack_b4[iVar15]) {
        iVar45 = iVar15;
      }
    }
    iVar15 = iVar45;
    if ((Pgno)local_278 == 0) {
      iVar15 = iVar45 + 1;
      local_e0[(long)iVar45 + 1] = local_258->aDataEnd;
      aPgOrder[(long)iVar45 + -5] = uVar44 + 1;
    }
    iVar45 = (int)local_240 - pMVar32->nFree;
    szNew[(long)pMVar37] = iVar45;
    for (uVar38 = 0; uVar38 < pMVar32->nOverflow; uVar38 = uVar38 + 1) {
      uVar12 = (*pMVar32->xCellSize)(pMVar32,pMVar32->apOvfl[uVar38]);
      iVar45 = iVar45 + (uint)uVar12 + 2;
      szNew[(long)pMVar37] = iVar45;
    }
    local_214[(long)((long)&pMVar37[-1].xParseCell + 7)] = uVar44;
    iVar15 = iVar15 + 1;
    pMVar32 = local_260;
  }
  local_288 = (MemPage *)CONCAT44(local_288._4_4_,pChild._0_4_);
  pMVar37 = (MemPage *)((ulong)local_248 & 0xffffffff);
  pMVar28 = (MemPage *)0x0;
LAB_001711ec:
  do {
    if ((long)(int)pMVar37 <= (long)pMVar28) {
      pMVar30 = (MemPage *)(ulong)((int)pMVar37 - 1);
      local_298 = local_e8;
      local_290 = (long)local_e8 - (ulong)(uint)((int)local_278 * 2);
      pMVar28 = pMVar30;
      local_238 = pMVar37;
      break;
    }
    iVar15 = szNew[(long)pMVar28];
    local_298 = (MemPage *)&pMVar28->bBusy;
    local_290 = CONCAT44(local_290._4_4_,(int)pMVar28 + 2);
    for (; (int)local_240 < iVar15; iVar15 = iVar15 - (uVar12 + 2)) {
      if ((int)pMVar37 <= (int)(uint)local_298) {
        if ((MemPage *)0x3 < pMVar28) {
          szNew[(long)pMVar28] = iVar15;
          iVar15 = 0x1157a;
          goto LAB_001713af;
        }
        szNew[(long)&pMVar28->bBusy] = 0;
        local_214[(long)pMVar28] = (uint)local_288;
        pMVar37 = (MemPage *)(local_290 & 0xffffffff);
      }
      uVar44 = local_214[(long)((long)&pMVar28[-1].xParseCell + 7)];
      uVar12 = cachedCellSize((CellArray *)&pChild,uVar44 - 1);
      iVar45 = uVar12 + 2;
      if ((Pgno)local_278 == 0) {
        iVar45 = 0;
        if ((int)uVar44 < (int)(uint)local_288) {
          uVar13 = cachedCellSize((CellArray *)&pChild,uVar44);
          iVar45 = uVar13 + 2;
        }
      }
      szNew[(long)&pMVar28->bBusy] = szNew[(long)&pMVar28->bBusy] + iVar45;
      local_214[(long)((long)&pMVar28[-1].xParseCell + 7)] = uVar44 - 1;
    }
    szNew[(long)pMVar28] = iVar15;
    uVar44 = local_214[(long)((long)&pMVar28[-1].xParseCell + 7)];
    while ((int)uVar44 < (int)(uint)local_288) {
      uVar14 = cachedCellSize((CellArray *)&pChild,uVar44);
      pMVar32 = local_260;
      iVar15 = iVar15 + (uint)uVar14 + 2;
      if ((int)local_240 < iVar15) {
        local_214[(long)((long)&pMVar28[-1].xParseCell + 7)] = uVar44;
        if (pMVar28 == (MemPage *)0x0) {
          iVar15 = 0;
        }
        else {
          iVar15 = *(int *)((long)&local_220 + (long)pMVar28 * 4 + 4);
        }
        pMVar28 = local_298;
        if (iVar15 < (int)uVar44) goto LAB_001711ec;
        iVar15 = sqlite3CorruptError(0x1159b);
        pCur = local_270;
        uVar44 = 0;
        goto LAB_001713c5;
      }
      uVar44 = uVar44 + 1;
      szNew[(long)pMVar28] = iVar15;
      if ((Pgno)local_278 == 0) {
        iVar45 = 0;
        if ((int)uVar44 < (int)(uint)local_288) {
          uVar14 = cachedCellSize((CellArray *)&pChild,uVar44);
          goto LAB_00171315;
        }
      }
      else {
LAB_00171315:
        iVar45 = uVar14 + 2;
      }
      szNew[(long)&pMVar28->bBusy] = szNew[(long)&pMVar28->bBusy] - iVar45;
    }
    local_214[(long)((long)&pMVar28[-1].xParseCell + 7)] = uVar44;
    pMVar37 = local_298;
    pMVar28 = local_298;
    pMVar32 = local_260;
  } while( true );
  do {
    pMVar37 = local_258;
    local_1a0 = (char)uVar43;
    if ((int)pMVar28 < 1) {
      local_290 = CONCAT44(local_290._4_4_,(uint)*pMVar39->aData);
      pMVar28 = (MemPage *)0x0;
      pMVar39 = (MemPage *)((ulong)local_238 & 0xffffffff);
      if ((int)local_238 < 1) {
        pMVar39 = pMVar28;
      }
      uVar43 = 0;
      local_238 = pMVar39;
      goto LAB_00171779;
    }
    iVar15 = szNew[(long)((long)&pMVar28[-1].xParseCell + 7)];
    iVar45 = szNew[(long)pMVar28];
    pMVar37 = (MemPage *)((long)&pMVar28[-1].xParseCell + 7);
    iVar17 = *(int *)((long)&local_220 + (long)pMVar28 * 4 + 4);
    uVar38 = (ulong)iVar17;
    cachedCellSize((CellArray *)&pChild,iVar17 - (Pgno)local_278);
    lVar25 = uVar38 + 1;
    local_230 = pMVar28;
    do {
      uVar44 = (uint)uVar38;
      uVar27 = uVar44 - 1;
      uVar38 = (ulong)uVar27;
      cachedCellSize((CellArray *)&pChild,uVar27);
      if (iVar45 == 0) {
        uVar14 = local_298->aiOvfl[lVar25 + -0x10];
        iVar17 = *(ushort *)((local_290 - 2) + lVar25 * 2) + 2;
      }
      else {
        if (local_1a0 != '\0') break;
        iVar17 = (uint)*(ushort *)((local_290 - 2) + lVar25 * 2) + iVar45 + 2;
        uVar14 = local_298->aiOvfl[lVar25 + -0x10];
        if ((int)(((uint)(pMVar28 == pMVar30) * 2 + -2 + iVar15) - (uint)uVar14) < iVar17) break;
      }
      iVar45 = iVar17;
      iVar15 = (iVar15 - (uint)uVar14) + -2;
      local_214[(long)((long)&pMVar37[-1].xParseCell + 7)] = uVar27;
      lVar25 = lVar25 + -1;
      uVar44 = uVar27;
    } while (1 < lVar25);
    szNew[(long)local_230] = iVar45;
    szNew[(long)pMVar37] = iVar15;
    uVar27 = 0;
    if (local_230 != (MemPage *)0x1) {
      uVar27 = local_214[(ulong)((int)local_230 - 2) - 1];
    }
    pMVar28 = pMVar37;
    pMVar32 = local_260;
  } while ((int)uVar27 < (int)uVar44);
  iVar15 = 0x115c5;
LAB_0017138d:
  pCur = local_270;
  local_29c = sqlite3CorruptError(iVar15);
LAB_00171396:
  uVar44 = 0;
  iVar15 = local_29c;
LAB_001713c5:
  local_29c = iVar15;
  sqlite3DbFree((sqlite3 *)0x0,local_f0);
  for (pMVar37 = (MemPage *)0x0; pMVar32 != pMVar37; pMVar37 = (MemPage *)&pMVar37->bBusy) {
    releasePage(apOld[(long)pMVar37]);
  }
  if ((int)uVar44 < 1) {
    uVar44 = 0;
  }
  for (uVar38 = 0; iVar15 = local_29c, uVar44 != uVar38; uVar38 = uVar38 + 1) {
    releasePage(local_150[uVar38 - 1]);
  }
LAB_0017141f:
  if (local_180 != (void *)0x0) {
    pcache1Free(local_180);
  }
LAB_00171441:
  local_180 = pvVar18;
  pPage->nOverflow = '\0';
  releasePage(pPage);
  cVar33 = pCur->iPage + -1;
  pCur->iPage = cVar33;
  pMVar37 = pCur->apPage[cVar33];
LAB_00171466:
  pCur->pPage = pMVar37;
  pPage = pMVar37;
  if (iVar15 != 0) {
LAB_00172215:
    if (local_180 != (void *)0x0) {
      pcache1Free(local_180);
    }
    return iVar15;
  }
  goto LAB_001707d9;
LAB_00171779:
  pBVar48 = local_250;
  pCur = local_270;
  uVar44 = uVar43;
  if (pMVar39 == pMVar28) goto LAB_00171868;
  if (pMVar46 < pMVar28) {
    PVar21 = 1;
    if (local_1a0 == '\0') {
      PVar21 = local_224;
    }
    local_29c = allocateBtreePage(local_250,(MemPage **)&local_170,&local_224,PVar21,'\0');
    iVar10 = local_170.nKey;
    pCur = local_270;
    iVar15 = local_29c;
    if (local_29c != 0) goto LAB_001713c5;
    zeroPage((MemPage *)local_170.nKey,(int)local_290);
    local_150[(long)((long)&pMVar28[-1].xParseCell + 7)] = (MemPage *)iVar10;
    *(uint *)(&szCell + (long)pMVar28 * 2) = (uint)local_288;
    pMVar39 = local_238;
    if (pBVar48->autoVacuum != '\0') {
      ptrmapPut(pBVar48,*(Pgno *)(iVar10 + 4),'\x05',pMVar37->pgno,&local_29c);
      pMVar39 = local_238;
      goto joined_r0x00171854;
    }
  }
  else {
    pMVar30 = apOld[(long)pMVar28];
    local_150[(long)((long)&pMVar28[-1].xParseCell + 7)] = pMVar30;
    apOld[(long)pMVar28] = (MemPage *)0x0;
    local_29c = sqlite3PagerWrite(pMVar30->pDbPage);
joined_r0x00171854:
    pCur = local_270;
    uVar44 = uVar43 + 1;
    iVar15 = local_29c;
    if (local_29c != 0) goto LAB_001713c5;
  }
  uVar43 = uVar43 + 1;
  pMVar28 = (MemPage *)&pMVar28->bBusy;
  goto LAB_00171779;
LAB_00171868:
  uVar38 = 0;
  if (0 < (int)uVar43) {
    uVar38 = (ulong)uVar43;
  }
  for (uVar40 = 0; uVar40 != uVar38; uVar40 = uVar40 + 1) {
    pMVar37 = local_150[uVar40 - 1];
    PVar21 = pMVar37->pgno;
    aPgno[uVar40] = PVar21;
    aPgOrder[uVar40] = PVar21;
    aPgFlags[uVar40] = pMVar37->pDbPage->flags;
    uVar20 = 0;
    while (uVar40 != uVar20) {
      pPVar1 = aPgno + uVar20;
      uVar20 = uVar20 + 1;
      if (*pPVar1 == PVar21) {
        iVar15 = sqlite3CorruptError(0x1160f);
        goto LAB_001713c5;
      }
    }
  }
  PVar21 = local_224;
  for (uVar40 = 0; uVar40 != uVar38; uVar40 = uVar40 + 1) {
    uVar26 = 0;
    uVar20 = 1;
    while( true ) {
      lVar25 = (long)(int)uVar26;
      if (uVar43 == uVar20) break;
      uVar11 = uVar20 & 0xffffffff;
      if (aPgOrder[lVar25] <= aPgOrder[uVar20]) {
        uVar11 = uVar26;
      }
      uVar26 = uVar11;
      uVar20 = uVar20 + 1;
    }
    PVar21 = aPgOrder[lVar25];
    aPgOrder[lVar25] = 0xffffffff;
    if (uVar40 != uVar26) {
      if ((long)uVar40 < lVar25) {
        pPVar7 = local_150[lVar25 + -1]->pDbPage;
        uVar16 = local_250->nPage;
        pPVar7->flags = 0;
        sqlite3PcacheMove(pPVar7,uVar16 + (int)uVar26 + 1);
      }
      pMVar37 = local_150[uVar40 - 1];
      pPVar7 = pMVar37->pDbPage;
      pPVar7->flags = aPgFlags[lVar25];
      sqlite3PcacheMove(pPVar7,PVar21);
      pMVar37->pgno = PVar21;
    }
  }
  lVar23 = (long)(int)uVar43;
  lVar25 = *(long *)(&local_170.nPayload + lVar23 * 2);
  uVar27 = *(uint *)(lVar25 + 4);
  *local_130 = uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 | (uVar27 & 0xff00) << 8 | uVar27 << 0x18;
  if (((local_290 & 8) == 0) && ((uint)local_248 != uVar43)) {
    ppMVar19 = apOld;
    if ((int)(uint)local_248 < (int)uVar43) {
      ppMVar19 = &pNew;
    }
    *(undefined4 *)(*(long *)(lVar25 + 0x50) + 8) =
         *(undefined4 *)(ppMVar19[(long)pMVar46]->aData + 8);
  }
  local_224 = PVar21;
  if (local_250->autoVacuum != '\0') {
    bVar50 = (Pgno)local_278 == 0;
    pMVar37 = (MemPage *)CONCAT44(pNew._4_4_,(int)pNew);
    uVar27 = (uint)pMVar37->nOverflow + (uint)pMVar37->nCell;
    iVar15 = 0;
    lVar25 = 0;
    local_298 = pMVar37;
    for (uVar40 = 0; (long)uVar40 < (long)(int)(uint)local_288; uVar40 = uVar40 + 1) {
      pMVar32 = local_f0[uVar40];
      lVar49 = (long)(int)lVar25;
      lVar25 = lVar25 << 0x20;
      ppMVar19 = apOld + lVar49 + 1;
      ppMVar31 = local_150 + lVar49;
      for (; uVar40 == uVar27;
          uVar27 = uVar27 + bVar50 + (uint)pMVar37->nCell + (uint)pMVar37->nOverflow) {
        lVar49 = lVar49 + 1;
        ppMVar41 = ppMVar19;
        if (lVar49 < lVar23) {
          ppMVar41 = ppMVar31;
        }
        pMVar37 = *ppMVar41;
        lVar25 = lVar25 + 0x100000000;
        ppMVar19 = ppMVar19 + 1;
        ppMVar31 = ppMVar31 + 1;
      }
      iVar45 = iVar15;
      if (uVar40 == local_214[(long)iVar15 + -1]) {
        iVar45 = iVar15 + 1;
        local_298 = local_150[iVar15];
        iVar15 = iVar45;
        if ((Pgno)local_278 != 0) goto LAB_00171ae1;
      }
      else {
LAB_00171ae1:
        if (((((int)uVar43 <= (int)lVar49) ||
             (local_298->pgno != *(Pgno *)((long)aPgno + (lVar25 >> 0x1e)))) ||
            (pMVar32 < (MemPage *)pMVar37->aData)) ||
           (iVar15 = iVar45, (MemPage *)pMVar37->aDataEnd <= pMVar32)) {
          local_248 = (MemPage **)CONCAT44(local_248._4_4_,iVar45);
          local_288 = pMVar32;
          if (bVar2 == 0) {
            uVar16 = sqlite3Get4byte(&pMVar32->isInit);
            ptrmapPut(local_250,uVar16,'\x05',local_298->pgno,&local_29c);
          }
          uVar12 = cachedCellSize((CellArray *)&pChild,(int)uVar40);
          if (local_298->minLocal < uVar12) {
            ptrmapPutOvflPtr(local_298,pMVar37,&local_288->isInit,&local_29c);
          }
          pCur = local_270;
          pMVar32 = local_260;
          iVar15 = local_29c;
          if (local_29c != 0) goto LAB_001713c5;
          local_288 = (MemPage *)CONCAT44(local_288._4_4_,pChild._0_4_);
          iVar15 = (uint)local_248;
        }
      }
      lVar25 = lVar49;
    }
    local_298 = local_e8;
  }
  local_248 = local_f0;
  uVar20 = 0;
  uVar40 = (ulong)(uVar43 - 1);
  if ((int)(uVar43 - 1) < 1) {
    uVar40 = uVar20;
  }
  uVar26 = local_280 & 0xffffffff;
  iVar45 = 0;
  local_290 = uVar40;
  local_280 = uVar26;
  for (; uVar40 != uVar20; uVar20 = uVar20 + 1) {
    pMVar37 = local_150[uVar20 - 1];
    lVar25 = (long)(int)local_214[uVar20 - 1];
    pMVar32 = local_248[lVar25];
    uVar27 = (int)local_220 + (uint)local_298->aiOvfl[lVar25 + -0xe];
    pMVar39 = (MemPage *)((long)iVar45 + (long)pvVar18);
    if (pMVar37->leaf == '\0') {
      puVar36 = pMVar37->aData;
      uVar4 = pMVar32->bBusy;
      uVar8 = pMVar32->intKey;
      uVar9 = pMVar32->intKeyLeaf;
      puVar36[8] = pMVar32->isInit;
      puVar36[9] = uVar4;
      puVar36[10] = uVar8;
      puVar36[0xb] = uVar9;
    }
    else if ((Pgno)local_278 == 0) {
      pMVar32 = (MemPage *)((long)&pMVar32[-1].xParseCell + 4);
      if (local_298->aiOvfl[lVar25 + -0xe] == 4) {
        uVar12 = (*local_258->xCellSize)(local_258,(u8 *)pMVar32);
        uVar27 = (uint)uVar12;
        uVar26 = local_280;
        uVar40 = local_290;
      }
    }
    else {
      (*pMVar37->xParseCell)(pMVar37,&local_248[lVar25 + -1]->isInit,&local_170);
      iVar15 = sqlite3PutVarint((uchar *)&pMVar39->pgno,local_170.nKey);
      uVar27 = iVar15 + 4;
      pMVar32 = pMVar39;
      pMVar39 = (MemPage *)0x0;
      uVar26 = local_280;
    }
    insertCell(local_258,(int)uVar20 + (int)uVar26,&pMVar32->isInit,uVar27,&pMVar39->isInit,
               pMVar37->pgno,&local_29c);
    pCur = local_270;
    pMVar32 = local_260;
    iVar15 = local_29c;
    if (local_29c != 0) goto LAB_001713c5;
    iVar45 = iVar45 + uVar27;
  }
  bVar50 = (Pgno)local_278 == 0;
  uVar27 = -uVar43;
  local_120 = pgnoNew;
  local_278 = local_f8;
  pMVar37 = local_128;
LAB_00171d29:
  do {
    uVar27 = uVar27 + 1;
    if ((int)uVar43 <= (int)uVar27) break;
    uVar22 = -uVar27;
    if (0 < (int)uVar27) {
      uVar22 = uVar27;
    }
    puVar42 = (uint *)(ulong)uVar22;
    if (abDone[(long)puVar42] == '\0') {
      if ((int)uVar27 < 0) {
        if ((int)(&local_11c)[(int)uVar22] < *(int *)((long)&local_220 + (long)(int)uVar22 * 4 + 4))
        goto LAB_00171d29;
LAB_00171d79:
        if ((uint)pMVar37 < uVar22) {
          uVar40 = (ulong)(uVar22 - 1);
          iVar15 = (uint)local_288;
        }
        else {
          uVar40 = (ulong)(int)(uVar22 - 1);
          iVar15 = *(int *)(&szCell + uVar40 * 2) + (uint)bVar50;
        }
        uVar22 = local_214[uVar40 - 1] + (uint)bVar50;
        local_290 = (ulong)uVar22;
        uVar22 = local_214[(long)puVar42 + -1] - uVar22;
      }
      else {
        if (uVar27 != 0) goto LAB_00171d79;
        local_290 = 0;
        iVar15 = 0;
        uVar22 = local_120;
      }
      local_280 = (ulong)uVar22;
      local_130 = puVar42;
      pMVar39 = local_150[(long)puVar42 + -1];
      puVar36 = pMVar39->aData;
      local_238 = (MemPage *)(ulong)pMVar39->hdrOffset;
      local_220 = (MemPage *)(pMVar39->aCellIdx + (int)(uVar22 * 2));
      uVar14 = pMVar39->nCell;
      bVar3 = pMVar39->nOverflow;
      uVar34 = (uint)uVar14;
      iVar17 = (int)local_290;
      local_230 = (MemPage *)CONCAT44(local_230._4_4_,iVar15);
      iVar45 = iVar15;
      uVar22 = uVar34;
      if (iVar15 < iVar17) {
        iVar45 = pageFreeArray(pMVar39,iVar15,iVar17 - iVar15,(CellArray *)&pChild);
        uVar22 = uVar34 - iVar45;
        if ((int)uVar34 < iVar45) {
          iVar15 = sqlite3CorruptError(0x112e6);
          pCur = local_270;
          pMVar32 = local_260;
          goto LAB_001713c5;
        }
        memmove(pMVar39->aCellIdx,pMVar39->aCellIdx + iVar45 * 2,
                (ulong)((uint)uVar14 + (uint)uVar14));
        iVar45 = (int)local_230;
      }
      iVar35 = (uint)uVar14 + iVar45 + (uint)bVar3;
      iFirst = (int)local_280 + (int)local_290;
      nCell = iVar35 - iFirst;
      if (nCell != 0 && iFirst <= iVar35) {
        iVar45 = pageFreeArray(pMVar39,iFirst,nCell,(CellArray *)&pChild);
        uVar22 = uVar22 - iVar45;
        iVar45 = (int)local_230;
      }
      local_170.nKey =
           (i64)(puVar36 +
                (ulong)((ushort)(*(ushort *)(puVar36 + 5 + (long)local_238) << 8 |
                                *(ushort *)(puVar36 + 5 + (long)local_238) >> 8) - 1 & 0xffff) + 1);
      if ((ulong)local_170.nKey < local_220) {
LAB_00172016:
        pMVar37 = local_128;
        lVar25 = (long)(int)local_290 * 2;
        for (uVar40 = local_280 & 0xffffffff; 0 < (int)uVar40; uVar40 = (ulong)((int)uVar40 - 1)) {
          if (*(short *)((long)local_298->aiOvfl + lVar25 + -0x1c) == 0) {
            uVar12 = (*local_278->xCellSize)(local_278,*(u8 **)((long)local_248 + lVar25 * 4));
            *(u16 *)((long)local_298->aiOvfl + lVar25 + -0x1c) = uVar12;
          }
          lVar25 = lVar25 + 2;
        }
        iVar15 = rebuildPage((CellArray *)&pChild,(int)local_290,(int)local_280,pMVar39);
        pCur = local_270;
        pMVar32 = local_260;
        if (iVar15 != 0) goto LAB_001713c5;
      }
      else {
        if ((int)local_290 < iVar45) {
          iVar45 = iVar15 - iVar17;
          if ((int)local_280 <= iVar15 - iVar17) {
            iVar45 = (int)local_280;
          }
          puVar47 = pMVar39->aCellIdx;
          memmove(puVar47 + iVar45 * 2,puVar47,(long)(int)(uVar22 * 2));
          iVar15 = pageInsertArray(pMVar39,&local_220->isInit,(u8 **)&local_170,puVar47,
                                   (int)local_290,iVar45,(CellArray *)&pChild);
          if (iVar15 != 0) goto LAB_00172016;
          uVar22 = uVar22 + iVar45;
          iVar45 = (int)local_230;
        }
        uVar20 = 0;
        uVar40 = local_290;
        while( true ) {
          if (pMVar39->nOverflow <= uVar20) break;
          iVar17 = (uint)pMVar39->aiOvfl[uVar20] + iVar45;
          iVar15 = iVar17 - (int)uVar40;
          if ((-1 < iVar15) && (iVar15 < (int)local_280)) {
            puVar47 = pMVar39->aCellIdx + (uint)(iVar15 * 2);
            if (uVar22 - iVar15 != 0 && iVar15 <= (int)uVar22) {
              memmove(puVar47 + 2,puVar47,(long)(int)((uVar22 - iVar15) * 2));
            }
            iVar15 = pageInsertArray(pMVar39,&local_220->isInit,(u8 **)&local_170,puVar47,iVar17,1,
                                     (CellArray *)&pChild);
            if (iVar15 != 0) goto LAB_00172016;
            uVar22 = uVar22 + 1;
            uVar40 = local_290;
            iVar45 = (int)local_230;
          }
          uVar20 = uVar20 + 1;
        }
        iVar15 = pageInsertArray(pMVar39,&local_220->isInit,(u8 **)&local_170,
                                 pMVar39->aCellIdx + (int)(uVar22 * 2),uVar22 + (int)uVar40,
                                 (int)local_280 - uVar22,(CellArray *)&pChild);
        if (iVar15 != 0) goto LAB_00172016;
        pMVar39->nCell = (u16)local_280;
        pMVar39->nOverflow = '\0';
        (puVar36 + 3)[(long)local_238] = (u8)(local_280 >> 8);
        (puVar36 + 4)[(long)local_238] = (u8)pMVar39->nCell;
        uVar14 = (short)local_170.nKey - (short)puVar36;
        *(ushort *)(puVar36 + 5 + (long)local_238) = uVar14 * 0x100 | uVar14 >> 8;
        pMVar37 = local_128;
      }
      puVar42 = local_130;
      abDone[(long)local_130] = '\x01';
      pMVar39->nFree = (int)local_240 - szNew[(long)puVar42];
    }
  } while( true );
  local_29c = 0;
  if (((local_261 == '\x01') && (local_258->nCell == 0)) &&
     (pMVar37 = (MemPage *)CONCAT44(pNew._4_4_,(int)pNew),
     (int)(uint)local_258->hdrOffset <= pMVar37->nFree)) {
    local_29c = defragmentPage(pMVar37,-1);
    copyNodeContent(pMVar37,local_258,&local_29c);
    freePage(pMVar37,&local_29c);
  }
  else if (bVar2 == 0 && local_250->autoVacuum != '\0') {
    for (uVar40 = 0; uVar38 != uVar40; uVar40 = uVar40 + 1) {
      pMVar37 = local_150[uVar40 - 1];
      uVar16 = sqlite3Get4byte(pMVar37->aData + 8);
      ptrmapPut(local_250,uVar16,'\x05',pMVar37->pgno,&local_29c);
    }
  }
  for (; pCur = local_270, pMVar32 = local_260, iVar15 = local_29c, lVar23 <= (long)pMVar46;
      lVar23 = lVar23 + 1) {
    freePage(apOld[lVar23],&local_29c);
  }
  goto LAB_001713c5;
}

Assistant:

static int balance(BtCursor *pCur){
  int rc = SQLITE_OK;
  const int nMin = pCur->pBt->usableSize * 2 / 3;
  u8 aBalanceQuickSpace[13];
  u8 *pFree = 0;

  VVA_ONLY( int balance_quick_called = 0 );
  VVA_ONLY( int balance_deeper_called = 0 );

  do {
    int iPage = pCur->iPage;
    MemPage *pPage = pCur->pPage;

    if( NEVER(pPage->nFree<0) && btreeComputeFreeSpace(pPage) ) break;
    if( iPage==0 ){
      if( pPage->nOverflow ){
        /* The root page of the b-tree is overfull. In this case call the
        ** balance_deeper() function to create a new child for the root-page
        ** and copy the current contents of the root-page to it. The
        ** next iteration of the do-loop will balance the child page.
        */ 
        assert( balance_deeper_called==0 );
        VVA_ONLY( balance_deeper_called++ );
        rc = balance_deeper(pPage, &pCur->apPage[1]);
        if( rc==SQLITE_OK ){
          pCur->iPage = 1;
          pCur->ix = 0;
          pCur->aiIdx[0] = 0;
          pCur->apPage[0] = pPage;
          pCur->pPage = pCur->apPage[1];
          assert( pCur->pPage->nOverflow );
        }
      }else{
        break;
      }
    }else if( pPage->nOverflow==0 && pPage->nFree<=nMin ){
      break;
    }else{
      MemPage * const pParent = pCur->apPage[iPage-1];
      int const iIdx = pCur->aiIdx[iPage-1];

      rc = sqlite3PagerWrite(pParent->pDbPage);
      if( rc==SQLITE_OK && pParent->nFree<0 ){
        rc = btreeComputeFreeSpace(pParent);
      }
      if( rc==SQLITE_OK ){
#ifndef SQLITE_OMIT_QUICKBALANCE
        if( pPage->intKeyLeaf
         && pPage->nOverflow==1
         && pPage->aiOvfl[0]==pPage->nCell
         && pParent->pgno!=1
         && pParent->nCell==iIdx
        ){
          /* Call balance_quick() to create a new sibling of pPage on which
          ** to store the overflow cell. balance_quick() inserts a new cell
          ** into pParent, which may cause pParent overflow. If this
          ** happens, the next iteration of the do-loop will balance pParent 
          ** use either balance_nonroot() or balance_deeper(). Until this
          ** happens, the overflow cell is stored in the aBalanceQuickSpace[]
          ** buffer. 
          **
          ** The purpose of the following assert() is to check that only a
          ** single call to balance_quick() is made for each call to this
          ** function. If this were not verified, a subtle bug involving reuse
          ** of the aBalanceQuickSpace[] might sneak in.
          */
          assert( balance_quick_called==0 ); 
          VVA_ONLY( balance_quick_called++ );
          rc = balance_quick(pParent, pPage, aBalanceQuickSpace);
        }else
#endif
        {
          /* In this case, call balance_nonroot() to redistribute cells
          ** between pPage and up to 2 of its sibling pages. This involves
          ** modifying the contents of pParent, which may cause pParent to
          ** become overfull or underfull. The next iteration of the do-loop
          ** will balance the parent page to correct this.
          ** 
          ** If the parent page becomes overfull, the overflow cell or cells
          ** are stored in the pSpace buffer allocated immediately below. 
          ** A subsequent iteration of the do-loop will deal with this by
          ** calling balance_nonroot() (balance_deeper() may be called first,
          ** but it doesn't deal with overflow cells - just moves them to a
          ** different page). Once this subsequent call to balance_nonroot() 
          ** has completed, it is safe to release the pSpace buffer used by
          ** the previous call, as the overflow cell data will have been 
          ** copied either into the body of a database page or into the new
          ** pSpace buffer passed to the latter call to balance_nonroot().
          */
          u8 *pSpace = sqlite3PageMalloc(pCur->pBt->pageSize);
          rc = balance_nonroot(pParent, iIdx, pSpace, iPage==1,
                               pCur->hints&BTREE_BULKLOAD);
          if( pFree ){
            /* If pFree is not NULL, it points to the pSpace buffer used 
            ** by a previous call to balance_nonroot(). Its contents are
            ** now stored either on real database pages or within the 
            ** new pSpace buffer, so it may be safely freed here. */
            sqlite3PageFree(pFree);
          }

          /* The pSpace buffer will be freed after the next call to
          ** balance_nonroot(), or just before this function returns, whichever
          ** comes first. */
          pFree = pSpace;
        }
      }

      pPage->nOverflow = 0;

      /* The next iteration of the do-loop balances the parent page. */
      releasePage(pPage);
      pCur->iPage--;
      assert( pCur->iPage>=0 );
      pCur->pPage = pCur->apPage[pCur->iPage];
    }
  }while( rc==SQLITE_OK );

  if( pFree ){
    sqlite3PageFree(pFree);
  }
  return rc;
}